

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void phosg::write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
               (char (*type) [5],void *data,be_uint32_t size,anon_class_8_1_54a39806 *writer)

{
  uint uVar1;
  be_uint32_t crc;
  uint local_28;
  reverse_endian<unsigned_int,_unsigned_int> local_24;
  
  local_24.
  super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
  .value = (converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
            )(converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
              )size.super_reverse_endian<unsigned_int,_unsigned_int>.
               super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
               .value;
  fwritex(writer->f,&local_24,4);
  fwritex(writer->f,type,4);
  if (local_24.
      super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
      .value != 0) {
    fwritex(writer->f,data,
            (ulong)((uint)local_24.
                          super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                          .value >> 0x18 |
                    ((uint)local_24.
                           super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                           .value & 0xff0000) >> 8 |
                    ((uint)local_24.
                           super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                           .value & 0xff00) << 8 |
                   (int)local_24.
                        super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                        .value << 0x18));
  }
  uVar1 = crc32(0,type,4);
  local_28 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if (local_24.
      super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
      .value != 0) {
    uVar1 = crc32(uVar1,data,
                  (uint)local_24.
                        super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                        .value >> 0x18 |
                  ((uint)local_24.
                         super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                         .value & 0xff0000) >> 8 |
                  ((uint)local_24.
                         super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                         .value & 0xff00) << 8 |
                  (int)local_24.
                       super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                       .value << 0x18);
    local_28 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  fwritex(writer->f,&local_28,4);
  return;
}

Assistant:

static void write_png_chunk(const char (&type)[5],
    const void* data, be_uint32_t size,
    Writer&& writer) {

  writer(&size, 4);
  writer(type, 4);
  if (size > 0) {
    writer(data, size);
  }

  // The CRC includes the chunk type, but not the length
  // The CRC of the (empty) IEND chunk is big-endian 0xAE426082
  be_uint32_t crc = crc32(0u, reinterpret_cast<const Bytef*>(type), 4);
  if (size > 0) {
    crc = crc32(crc, static_cast<const Bytef*>(data), size);
  }
  writer(&crc, 4);
}